

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O0

ON_Text * ON_Text::CreateFromV5TextObject
                    (ON_OBSOLETE_V5_TextObject *V5_text_object,
                    ON_3dmAnnotationContext *annotation_context,ON_Text *destination)

{
  double dVar1;
  double dVar2;
  TextHorizontalAlignment value;
  TextVerticalAlignment value_00;
  bool bVar3;
  TextHorizontalAlignment TVar4;
  TextVerticalAlignment TVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ON_Color color;
  ON_DimStyle *pOVar9;
  ON_Plane *pOVar10;
  wchar_t *pwVar11;
  ON_TextMask *pOVar12;
  ON_3dmAnnotationSettings *pOVar13;
  ON_Annotation *local_2b8;
  ON_DimStyle *parent_dim_style;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_278;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_274;
  int local_270;
  MaskType local_269;
  int mc;
  MaskType mt;
  double mb;
  undefined1 auStack_258 [7];
  bool drawmask;
  ON_TextMask mask;
  undefined1 auStack_228 [7];
  bool setmask;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  ON_Plane local_1a8;
  double local_128;
  double width;
  double widthscale;
  double dsht;
  double dimscale;
  bool wraptext;
  ON_wString newtxt;
  double wrapwidth;
  ON_Text *V6_text_object;
  ON_wString txt;
  double v5height;
  ON_Plane plane;
  TextVerticalAlignment valign;
  TextHorizontalAlignment halign;
  uint just;
  ON_DimStyle *dim_style;
  ON_Text *destination_local;
  ON_3dmAnnotationContext *annotation_context_local;
  ON_OBSOLETE_V5_TextObject *V5_text_object_local;
  
  destination_local = (ON_Text *)annotation_context;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    destination_local = (ON_Text *)&ON_3dmAnnotationContext::Default;
  }
  pOVar9 = ON_3dmAnnotationContext::DimStyle((ON_3dmAnnotationContext *)destination_local);
  uVar7 = (*(V5_text_object->super_ON_OBSOLETE_V5_Annotation).super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[0x26])();
  value = ON::TextHorizontalAlignmentFromV5Justification(uVar7);
  value_00 = ON::TextVerticalAlignmentFromV5Justification(uVar7);
  pOVar10 = ON_OBSOLETE_V5_Annotation::Plane(&V5_text_object->super_ON_OBSOLETE_V5_Annotation);
  plane.plane_equation.y = (pOVar10->plane_equation).z;
  plane.plane_equation.z = (pOVar10->plane_equation).d;
  plane.zaxis.z = (pOVar10->plane_equation).x;
  plane.plane_equation.x = (pOVar10->plane_equation).y;
  plane.zaxis.x = (pOVar10->zaxis).y;
  plane.zaxis.y = (pOVar10->zaxis).z;
  plane.yaxis.y = (pOVar10->yaxis).z;
  plane.yaxis.z = (pOVar10->zaxis).x;
  v5height = (pOVar10->origin).x;
  plane.origin.x = (pOVar10->origin).y;
  plane.origin.y = (pOVar10->origin).z;
  plane.origin.z = (pOVar10->xaxis).x;
  plane.xaxis.x = (pOVar10->xaxis).y;
  plane.xaxis.y = (pOVar10->xaxis).z;
  plane.xaxis.z = (pOVar10->yaxis).x;
  plane.yaxis.x = (pOVar10->yaxis).y;
  dVar1 = ON_OBSOLETE_V5_Annotation::Height(&V5_text_object->super_ON_OBSOLETE_V5_Annotation);
  pwVar11 = ON_OBSOLETE_V5_Annotation::TextFormula(&V5_text_object->super_ON_OBSOLETE_V5_Annotation)
  ;
  ON_wString::ON_wString((ON_wString *)&V6_text_object,pwVar11);
  bVar3 = ON_wString::IsEmpty((ON_wString *)&V6_text_object);
  if (bVar3) {
    pwVar11 = ON_OBSOLETE_V5_Annotation::TextValue(&V5_text_object->super_ON_OBSOLETE_V5_Annotation)
    ;
    ON_wString::operator=((ON_wString *)&V6_text_object,pwVar11);
  }
  local_2b8 = &destination->super_ON_Annotation;
  if (destination == (ON_Text *)0x0) {
    local_2b8 = (ON_Annotation *)operator_new(0x318);
    ON_Text((ON_Text *)local_2b8);
  }
  newtxt.m_s = (wchar_t *)0x0;
  ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffff00);
  pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&V6_text_object);
  dimscale._7_1_ =
       RemoveV5Wrapping(pwVar11,pOVar9,(double *)&newtxt,(ON_wString *)&stack0xffffffffffffff00);
  ON_wString::Replace((ON_wString *)&stack0xffffffffffffff00,L"\\",L"\\\\");
  if ((dimscale._7_1_ & 1) == 0) {
    pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff00);
    local_1b8 = plane.plane_equation.y;
    dStack_1b0 = plane.plane_equation.z;
    local_1c8 = plane.zaxis.z;
    dStack_1c0 = plane.plane_equation.x;
    local_1d8 = plane.zaxis.x;
    dStack_1d0 = plane.zaxis.y;
    local_1e8 = plane.yaxis.y;
    dStack_1e0 = plane.yaxis.z;
    local_1f8 = plane.xaxis.z;
    dStack_1f0 = plane.yaxis.x;
    local_208 = plane.xaxis.x;
    dStack_200 = plane.xaxis.y;
    local_218 = plane.origin.y;
    dStack_210 = plane.origin.z;
    _auStack_228 = v5height;
    dStack_220 = plane.origin.x;
    Create((ON_Text *)local_2b8,pwVar11,pOVar9,(ON_Plane *)auStack_228);
    ON_Plane::~ON_Plane((ON_Plane *)auStack_228);
  }
  else {
    dsht = ON_DimStyle::DimScale(pOVar9);
    widthscale = ON_DimStyle::TextHeight(pOVar9);
    width = (dVar1 * dsht) / widthscale;
    local_128 = (dVar1 * 0.1 + (double)newtxt.m_s) * width;
    pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffff00);
    local_1a8.plane_equation.z = plane.plane_equation.y;
    local_1a8.plane_equation.d = plane.plane_equation.z;
    local_1a8.plane_equation.x = plane.zaxis.z;
    local_1a8.plane_equation.y = plane.plane_equation.x;
    local_1a8.zaxis.y = plane.zaxis.x;
    local_1a8.zaxis.z = plane.zaxis.y;
    local_1a8.yaxis.z = plane.yaxis.y;
    local_1a8.zaxis.x = plane.yaxis.z;
    local_1a8.yaxis.x = plane.xaxis.z;
    local_1a8.yaxis.y = plane.yaxis.x;
    local_1a8.xaxis.y = plane.xaxis.x;
    local_1a8.xaxis.z = plane.xaxis.y;
    local_1a8.origin.z = plane.origin.y;
    local_1a8.xaxis.x = plane.origin.z;
    local_1a8.origin.x = v5height;
    local_1a8.origin.y = plane.origin.x;
    Create((ON_Text *)local_2b8,pwVar11,pOVar9,&local_1a8,true,local_128,0.0);
    ON_Plane::~ON_Plane(&local_1a8);
  }
  if (0.0 < dVar1) {
    dVar2 = ON_DimStyle::TextHeight(pOVar9);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      ON_Annotation::SetTextHeight(local_2b8,pOVar9,dVar1);
    }
  }
  TVar4 = ON_DimStyle::TextHorizontalAlignment(pOVar9);
  if (value != TVar4) {
    ON_Annotation::SetTextHorizontalAlignment(local_2b8,pOVar9,value);
  }
  TVar5 = ON_DimStyle::TextVerticalAlignment(pOVar9);
  if (value_00 != TVar5) {
    ON_Annotation::SetTextVerticalAlignment(local_2b8,pOVar9,value_00);
  }
  mask.m_content_hash.m_digest[0x13] = '\0';
  pOVar12 = ON_DimStyle::TextMask(pOVar9);
  mask.m_content_hash.m_digest._4_8_ = *(undefined8 *)((pOVar12->m_content_hash).m_digest + 0xc);
  auStack_258[0] = pOVar12->m_bDrawMask;
  auStack_258[1] = pOVar12->m_mask_type;
  auStack_258[2] = pOVar12->m_mask_frame;
  auStack_258[3] = pOVar12->m_reserved2;
  unique0x10001012 = (pOVar12->m_mask_color).field_0;
  mask._0_8_ = pOVar12->m_mask_border;
  mask.m_mask_border = *(double *)&pOVar12->m_reserved3;
  mask._16_8_ = *(undefined8 *)((pOVar12->m_content_hash).m_digest + 4);
  bVar3 = ON_OBSOLETE_V5_TextObject::DrawTextMask(V5_text_object);
  mb._7_1_ = bVar3;
  bVar6 = ON_TextMask::DrawTextMask((ON_TextMask *)auStack_258);
  if (bVar3 != bVar6) {
    ON_TextMask::SetDrawTextMask((ON_TextMask *)auStack_258,(bool)(mb._7_1_ & 1));
    mask.m_content_hash.m_digest[0x13] = '\x01';
  }
  if ((mb._7_1_ & 1) != 0) {
    dVar2 = ON_OBSOLETE_V5_TextObject::MaskOffsetFactor(V5_text_object);
    dVar2 = dVar2 * dVar1;
    _mc = dVar2;
    dVar1 = ON_TextMask::MaskBorder((ON_TextMask *)auStack_258);
    if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
      ON_TextMask::SetMaskBorder((ON_TextMask *)auStack_258,_mc);
      mask.m_content_hash.m_digest[0x13] = '\x01';
    }
    local_269 = ON_TextMask::MaskFillType((ON_TextMask *)auStack_258);
    local_270 = ON_OBSOLETE_V5_TextObject::MaskColorSource(V5_text_object);
    if (((local_269 == BackgroundColor) && (local_270 != 0)) ||
       ((local_269 == MaskColor && (local_270 != 1)))) {
      ON_TextMask::SetMaskFillType((ON_TextMask *)auStack_258,local_270 != 0);
      mask.m_content_hash.m_digest[0x13] = '\x01';
    }
    local_274 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                ON_OBSOLETE_V5_TextObject::MaskColor(V5_text_object);
    uVar7 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_274);
    local_278 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                ON_TextMask::MaskColor((ON_TextMask *)auStack_258);
    uVar8 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_278);
    if (uVar7 != uVar8) {
      color = ON_OBSOLETE_V5_TextObject::MaskColor(V5_text_object);
      ON_TextMask::SetMaskColor((ON_TextMask *)auStack_258,color);
      mask.m_content_hash.m_digest[0x13] = '\x01';
    }
  }
  if ((mask.m_content_hash.m_digest[0x13] & 1) != 0) {
    ON_Annotation::SetTextMask(local_2b8,pOVar9,(ON_TextMask *)auStack_258);
  }
  if ((((V5_text_object->super_ON_OBSOLETE_V5_Annotation).m_annotative_scale & 1U) != 0) &&
     (bVar3 = ON_3dmAnnotationContext::AnnotationSettingsAreSet
                        ((ON_3dmAnnotationContext *)destination_local), bVar3)) {
    pOVar13 = ON_3dmAnnotationContext::AnnotationSettings
                        ((ON_3dmAnnotationContext *)destination_local);
    bVar3 = ON_3dmAnnotationSettings::Is_V5_AnnotationScalingEnabled(pOVar13);
    if (bVar3) {
      pOVar13 = ON_3dmAnnotationContext::AnnotationSettings
                          ((ON_3dmAnnotationContext *)destination_local);
      dVar1 = ON_3dmAnnotationSettings::WorldViewTextScale(pOVar13);
      dVar2 = ON_DimStyle::DimScale(pOVar9);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        pOVar13 = ON_3dmAnnotationContext::AnnotationSettings
                            ((ON_3dmAnnotationContext *)destination_local);
        dVar1 = ON_3dmAnnotationSettings::WorldViewTextScale(pOVar13);
        ON_Annotation::SetDimScale(local_2b8,pOVar9,dVar1);
      }
    }
    else {
      dVar1 = ON_DimStyle::DimScale(pOVar9);
      if ((dVar1 != 1.0) || (NAN(dVar1))) {
        ON_Annotation::SetDimScale(local_2b8,pOVar9,1.0);
      }
    }
  }
  Internal_SetObsoleteV5TextObjectInformation
            ((ON_Text *)local_2b8,(ON_3dmAnnotationContext *)destination_local,V5_text_object);
  pOVar9 = ON_3dmAnnotationContext::ParentDimStyle((ON_3dmAnnotationContext *)destination_local);
  ON_DimStyle::ContentHash(pOVar9);
  pOVar9 = ON_Annotation::DimensionStyle(local_2b8,pOVar9);
  ON_DimStyle::ContentHash(pOVar9);
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff00);
  ON_wString::~ON_wString((ON_wString *)&V6_text_object);
  ON_Plane::~ON_Plane((ON_Plane *)&v5height);
  return (ON_Text *)local_2b8;
}

Assistant:

ON_Text* ON_Text::CreateFromV5TextObject(
  const class ON_OBSOLETE_V5_TextObject& V5_text_object,
  const class ON_3dmAnnotationContext* annotation_context,
  ON_Text* destination
)
{
  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  const ON_DimStyle& dim_style = annotation_context->DimStyle();

  const unsigned int just = V5_text_object.Justification();
  const ON::TextHorizontalAlignment halign = ON::TextHorizontalAlignmentFromV5Justification(just);
  const ON::TextVerticalAlignment valign = ON::TextVerticalAlignmentFromV5Justification(just);

  ON_Plane plane = V5_text_object.Plane();
  const double v5height = V5_text_object.Height();
  ON_wString txt = V5_text_object.TextFormula();
  if (txt.IsEmpty())
    txt = V5_text_object.TextValue();

  ON_Text* V6_text_object = (nullptr != destination)
    ? destination
    : new ON_Text();

  double wrapwidth = 0.0;
  ON_wString newtxt;
  bool wraptext = RemoveV5Wrapping(txt, dim_style, wrapwidth, newtxt);

  newtxt.Replace(L"\\", L"\\\\");

  if (wraptext)
  {
    double dimscale = dim_style.DimScale();
    double dsht = dim_style.TextHeight();
    double widthscale = v5height * dimscale / dsht;
    double width = (wrapwidth + (v5height * 0.1)) * widthscale;
    V6_text_object->Create(newtxt, &dim_style, plane, true, width, 0.0);
  }
  else
    V6_text_object->Create(newtxt, &dim_style, plane);

    // These override settings currently get erased by 
  // ON_Annotation::SetDimensionStyleId(ON_UUID dimstyle_id)
  // which deletes any existing override style

  if (v5height > 0.0 && v5height != dim_style.TextHeight())
    V6_text_object->SetTextHeight(&dim_style, v5height);
  if (halign != dim_style.TextHorizontalAlignment())
    V6_text_object->SetTextHorizontalAlignment(&dim_style, halign);
  if (valign != dim_style.TextVerticalAlignment())
    V6_text_object->SetTextVerticalAlignment(&dim_style, valign);

  bool setmask = false;
  ON_TextMask mask = dim_style.TextMask();
  bool drawmask = V5_text_object.DrawTextMask();
  if (drawmask != mask.DrawTextMask())
  {
    mask.SetDrawTextMask(drawmask);
    setmask = true;
  }
  if (drawmask)
  {
    double mb = V5_text_object.MaskOffsetFactor() * v5height;
    if (mb != mask.MaskBorder())
    {
      mask.SetMaskBorder(mb);
      setmask = true;
    }
    ON_TextMask::MaskType mt = mask.MaskFillType();
    int mc = V5_text_object.MaskColorSource();
    if ((mt == ON_TextMask::MaskType::BackgroundColor && mc != 0) ||
      (mt == ON_TextMask::MaskType::MaskColor && mc != 1))
    {
      mask.SetMaskFillType(mc == 0 ? ON_TextMask::MaskType::BackgroundColor : ON_TextMask::MaskType::MaskColor);
      setmask = true;
    }
    if (V5_text_object.MaskColor() != mask.MaskColor())
    {
      mask.SetMaskColor(V5_text_object.MaskColor());
      setmask = true;
    }
  }
  if (setmask)
    V6_text_object->SetTextMask(&dim_style, mask);


  if (V5_text_object.m_annotative_scale && annotation_context->AnnotationSettingsAreSet())
  {
    if (false == annotation_context->AnnotationSettings().Is_V5_AnnotationScalingEnabled())
    {
      if (!(1.0 == dim_style.DimScale()))
      {
        V6_text_object->SetDimScale(&dim_style, 1.0);
      }
    }
    else
    {
      if (!(annotation_context->AnnotationSettings().WorldViewTextScale() == dim_style.DimScale()))
      {
        V6_text_object->SetDimScale(&dim_style, annotation_context->AnnotationSettings().WorldViewTextScale());
      }
    }
  }
  V6_text_object->Internal_SetObsoleteV5TextObjectInformation(
    annotation_context,
    V5_text_object
  );

  // updates any m_overrides to be current and updates content hash.
  const ON_DimStyle& parent_dim_style = annotation_context->ParentDimStyle();
  parent_dim_style.ContentHash();
  V6_text_object->DimensionStyle(parent_dim_style).ContentHash();

  return V6_text_object;
}